

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUtility.cpp
# Opt level: O0

uint8_t GmmIsP0xx(GMM_RESOURCE_FORMAT Format)

{
  uint8_t Status;
  GMM_RESOURCE_FORMAT Format_local;
  
  return Format - GMM_FORMAT_P010 < 3;
}

Assistant:

uint8_t GMM_STDCALL GmmIsP0xx(GMM_RESOURCE_FORMAT Format)
{
    uint8_t Status = 0;

    switch(Format)
    {
        case GMM_FORMAT_P010:
        case GMM_FORMAT_P012:
        case GMM_FORMAT_P016:
            Status = 1;
            break;
        default:
            Status = 0;
            break;
    }

    return Status;
}